

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_pack4.h
# Opt level: O1

void ncnn::im2col_sgemm_pack4_sse
               (Mat *bottom_im2col,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  uint uVar5;
  int iVar6;
  uint _h;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  int *piVar11;
  uint uVar12;
  uint uVar13;
  _func_int ***ppp_Var14;
  long lVar15;
  ulong uVar16;
  int nn_1;
  int iVar17;
  int iVar18;
  int iVar19;
  ulong uVar20;
  undefined1 (*pauVar21) [16];
  undefined1 (*pauVar22) [16];
  long lVar23;
  float *pfVar24;
  int iVar25;
  int iVar26;
  long lVar27;
  ulong uVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  int nn;
  float zeros [4];
  Mat local_b8;
  int local_64;
  ulong local_60;
  void *local_58;
  Mat *local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  uVar5 = bottom_im2col->w;
  iVar6 = bottom_im2col->h;
  _h = bottom_im2col->c;
  uVar28 = (ulong)_h;
  local_60 = (ulong)(uint)top_blob->c;
  local_58 = _bias->data;
  local_b8.cstep = 0;
  local_b8.data = (Allocator *)0x0;
  local_b8.refcount._0_4_ = 0;
  local_b8.refcount._4_4_ = 0;
  local_b8.elemsize._0_4_ = 0;
  local_b8.elempack = 0;
  local_b8._48_8_ = SUB168(ZEXT816(0) << 0x40,4);
  if ((long)(int)uVar5 < 0xc) {
    if ((int)uVar5 < 8) {
      if ((int)uVar5 < 4) {
        iVar25 = iVar6;
        uVar13 = uVar5;
        if (1 < (int)uVar5) {
          iVar25 = iVar6 * 2;
          uVar13 = (uVar5 & 1) + 1;
        }
      }
      else {
        iVar25 = iVar6 * 4;
        uVar13 = (uVar5 & 1) + 1 + (uint)((uVar5 >> 1 & 1) != 0);
      }
    }
    else {
      iVar25 = iVar6 * 8;
      uVar13 = (uVar5 & 1) + 1 + (uVar5 >> 2 & 1) + (uint)((uVar5 >> 1 & 1) != 0);
    }
  }
  else {
    uVar13 = uVar5 % 0xc;
    iVar25 = iVar6 * 0xc;
    uVar13 = (uVar13 & 1) + (uVar13 >> 3) + uVar5 / 0xc + (uVar13 >> 2 & 1) +
             (uint)((uVar13 >> 1 & 1) != 0);
  }
  local_b8.elemsize._4_4_ = (int)local_b8.refcount;
  local_b8.allocator = (Allocator *)local_b8.data;
  local_b8.dims = (int)local_b8.refcount;
  local_b8.w = local_b8.refcount._4_4_;
  local_b8.c = local_b8.elempack;
  local_50 = top_blob;
  Mat::create(&local_b8,iVar25,_h,uVar13,0x10,4,opt->workspace_allocator);
  if (0xb < (int)uVar5) {
    uVar16 = 0;
    do {
      if (0 < (int)_h) {
        ppp_Var14 = (_func_int ***)
                    ((long)(_func_int ***)local_b8.data +
                    local_b8.cstep * uVar16 *
                    CONCAT44(local_b8.elemsize._4_4_,(undefined4)local_b8.elemsize));
        uVar20 = 0;
        do {
          if (0 < iVar6) {
            pauVar22 = (undefined1 (*) [16])
                       ((long)bottom_im2col->data +
                       bottom_im2col->cstep * bottom_im2col->elemsize * uVar20 +
                       ((long)((uVar16 << 0x24) * 3) >> 0x1e) + 0xb0);
            iVar25 = iVar6;
            do {
              auVar55 = vunpcklps_avx(pauVar22[-0xb],pauVar22[-10]);
              auVar52 = vunpcklps_avx(pauVar22[-9],pauVar22[-8]);
              auVar54 = vunpckhps_avx(pauVar22[-0xb],pauVar22[-10]);
              auVar53 = vunpckhps_avx(pauVar22[-9],pauVar22[-8]);
              auVar29 = vmovlhps_avx(auVar55,auVar52);
              auVar48 = vunpckhpd_avx(auVar55,auVar52);
              auVar55 = vmovlhps_avx(auVar54,auVar53);
              auVar46 = vunpckhpd_avx(auVar54,auVar53);
              auVar53 = vunpcklps_avx(pauVar22[-7],pauVar22[-6]);
              auVar44 = vunpcklps_avx(pauVar22[-5],pauVar22[-4]);
              auVar52 = vunpckhps_avx(pauVar22[-7],pauVar22[-6]);
              auVar50 = vunpckhps_avx(pauVar22[-5],pauVar22[-4]);
              auVar54 = vmovlhps_avx(auVar53,auVar44);
              auVar44 = vunpckhpd_avx(auVar53,auVar44);
              auVar53 = vmovlhps_avx(auVar52,auVar50);
              auVar41 = vunpckhpd_avx(auVar52,auVar50);
              auVar50 = vunpcklps_avx(pauVar22[-3],pauVar22[-2]);
              auVar38 = vunpcklps_avx(pauVar22[-1],*pauVar22);
              auVar34 = vunpckhps_avx(pauVar22[-3],pauVar22[-2]);
              auVar51 = vunpckhps_avx(pauVar22[-1],*pauVar22);
              auVar52 = vmovlhps_avx(auVar50,auVar38);
              auVar38 = vunpckhpd_avx(auVar50,auVar38);
              auVar50 = vmovlhps_avx(auVar34,auVar51);
              auVar34 = vunpckhpd_avx(auVar34,auVar51);
              *(undefined1 (*) [16])ppp_Var14 = auVar29;
              *(undefined1 (*) [16])(ppp_Var14 + 2) = auVar54;
              *(undefined1 (*) [16])(ppp_Var14 + 4) = auVar52;
              *(undefined1 (*) [16])(ppp_Var14 + 6) = auVar48;
              *(undefined1 (*) [16])(ppp_Var14 + 8) = auVar44;
              *(undefined1 (*) [16])(ppp_Var14 + 10) = auVar38;
              *(undefined1 (*) [16])(ppp_Var14 + 0xc) = auVar55;
              *(undefined1 (*) [16])(ppp_Var14 + 0xe) = auVar53;
              *(undefined1 (*) [16])(ppp_Var14 + 0x10) = auVar50;
              *(undefined1 (*) [16])(ppp_Var14 + 0x12) = auVar46;
              *(undefined1 (*) [16])(ppp_Var14 + 0x14) = auVar41;
              *(undefined1 (*) [16])(ppp_Var14 + 0x16) = auVar34;
              ppp_Var14 = ppp_Var14 + 0x18;
              pauVar22 = (undefined1 (*) [16])(*pauVar22 + (ulong)(uVar5 * 4) * 4);
              iVar25 = iVar25 + -1;
            } while (iVar25 != 0);
          }
          uVar20 = uVar20 + 1;
        } while (uVar20 != uVar28);
      }
      uVar16 = uVar16 + 1;
    } while (uVar16 != (uint)((int)uVar5 / 0xc));
  }
  iVar25 = ((int)uVar5 / 0xc) * 0xc;
  uVar13 = (int)uVar5 % 0xc >> 3;
  if (0 < (int)uVar13) {
    lVar15 = (long)iVar25 * 0x10 + 0x40;
    uVar16 = 0;
    do {
      if (0 < (int)_h) {
        iVar17 = iVar25 + (int)uVar16 * 8;
        iVar18 = iVar17 % 0xc;
        iVar26 = iVar18 + 7;
        if (-1 < iVar18) {
          iVar26 = iVar18;
        }
        ppp_Var14 = (_func_int ***)
                    ((long)(_func_int ***)local_b8.data +
                    (long)((iVar26 >> 3) + iVar17 / 0xc) * local_b8.cstep *
                    CONCAT44(local_b8.elemsize._4_4_,(undefined4)local_b8.elemsize));
        uVar20 = 0;
        do {
          if (0 < iVar6) {
            pauVar22 = (undefined1 (*) [16])
                       ((long)bottom_im2col->data +
                       bottom_im2col->cstep * bottom_im2col->elemsize * uVar20 + lVar15);
            iVar26 = iVar6;
            do {
              auVar55 = vunpcklps_avx(pauVar22[-4],pauVar22[-3]);
              auVar52 = vunpcklps_avx(pauVar22[-2],pauVar22[-1]);
              auVar54 = vunpckhps_avx(pauVar22[-4],pauVar22[-3]);
              auVar53 = vunpckhps_avx(pauVar22[-2],pauVar22[-1]);
              auVar29 = vmovlhps_avx(auVar55,auVar52);
              auVar52 = vunpckhpd_avx(auVar55,auVar52);
              auVar55 = vmovlhps_avx(auVar54,auVar53);
              auVar50 = vunpckhpd_avx(auVar54,auVar53);
              auVar53 = vunpcklps_avx(*pauVar22,pauVar22[1]);
              auVar48 = vunpcklps_avx(pauVar22[2],pauVar22[3]);
              auVar46 = vunpckhps_avx(*pauVar22,pauVar22[1]);
              auVar44 = vunpckhps_avx(pauVar22[2],pauVar22[3]);
              auVar54 = vmovlhps_avx(auVar53,auVar48);
              auVar48 = vunpckhpd_avx(auVar53,auVar48);
              auVar53 = vmovlhps_avx(auVar46,auVar44);
              auVar46 = vunpckhpd_avx(auVar46,auVar44);
              *(undefined1 (*) [16])ppp_Var14 = auVar29;
              *(undefined1 (*) [16])(ppp_Var14 + 2) = auVar54;
              *(undefined1 (*) [16])(ppp_Var14 + 4) = auVar52;
              *(undefined1 (*) [16])(ppp_Var14 + 6) = auVar48;
              *(undefined1 (*) [16])(ppp_Var14 + 8) = auVar55;
              *(undefined1 (*) [16])(ppp_Var14 + 10) = auVar53;
              *(undefined1 (*) [16])(ppp_Var14 + 0xc) = auVar50;
              *(undefined1 (*) [16])(ppp_Var14 + 0xe) = auVar46;
              ppp_Var14 = ppp_Var14 + 0x10;
              pauVar22 = (undefined1 (*) [16])(*pauVar22 + (long)(int)(uVar5 * 4) * 4);
              iVar26 = iVar26 + -1;
            } while (iVar26 != 0);
          }
          uVar20 = uVar20 + 1;
        } while (uVar20 != uVar28);
      }
      uVar16 = uVar16 + 1;
      lVar15 = lVar15 + 0x80;
    } while (uVar16 != uVar13);
  }
  iVar25 = ((int)uVar5 % 0xc & 0xfffffff8U) + iVar25;
  uVar13 = (int)(uVar5 - iVar25) >> 2;
  if (0 < (int)uVar13) {
    lVar15 = (long)iVar25 * 0x10 + 0x30;
    uVar16 = 0;
    do {
      if (0 < (int)_h) {
        iVar17 = iVar25 + (int)uVar16 * 4;
        iVar18 = iVar17 % 0xc;
        iVar26 = iVar18 + 7;
        if (-1 < iVar18) {
          iVar26 = iVar18;
        }
        ppp_Var14 = (_func_int ***)
                    ((long)(_func_int ***)local_b8.data +
                    (long)((iVar18 % 8 >> 2) + (iVar26 >> 3) + iVar17 / 0xc) * local_b8.cstep *
                    CONCAT44(local_b8.elemsize._4_4_,(undefined4)local_b8.elemsize));
        uVar20 = 0;
        do {
          if (0 < iVar6) {
            pauVar22 = (undefined1 (*) [16])
                       ((long)bottom_im2col->data +
                       bottom_im2col->cstep * bottom_im2col->elemsize * uVar20 + lVar15);
            iVar26 = iVar6;
            do {
              auVar55 = vunpcklps_avx(pauVar22[-3],pauVar22[-2]);
              auVar54 = vunpcklps_avx(pauVar22[-1],*pauVar22);
              auVar53 = vunpckhps_avx(pauVar22[-3],pauVar22[-2]);
              auVar52 = vunpckhps_avx(pauVar22[-1],*pauVar22);
              auVar29 = vmovlhps_avx(auVar55,auVar54);
              auVar54 = vunpckhpd_avx(auVar55,auVar54);
              auVar55 = vmovlhps_avx(auVar53,auVar52);
              auVar53 = vunpckhpd_avx(auVar53,auVar52);
              *(undefined1 (*) [16])ppp_Var14 = auVar29;
              *(undefined1 (*) [16])(ppp_Var14 + 2) = auVar54;
              *(undefined1 (*) [16])(ppp_Var14 + 4) = auVar55;
              *(undefined1 (*) [16])(ppp_Var14 + 6) = auVar53;
              ppp_Var14 = ppp_Var14 + 8;
              pauVar22 = (undefined1 (*) [16])(*pauVar22 + (long)(int)(uVar5 * 4) * 4);
              iVar26 = iVar26 + -1;
            } while (iVar26 != 0);
          }
          uVar20 = uVar20 + 1;
        } while (uVar20 != uVar28);
      }
      uVar16 = uVar16 + 1;
      lVar15 = lVar15 + 0x40;
    } while (uVar16 != uVar13);
  }
  iVar25 = (uVar5 - iVar25 & 0xfffffffc) + iVar25;
  uVar13 = (int)(uVar5 - iVar25) >> 1;
  if (0 < (int)uVar13) {
    lVar15 = (long)iVar25 * 0x10 + 0x10;
    uVar16 = 0;
    do {
      if (0 < (int)_h) {
        iVar17 = iVar25 + (int)uVar16 * 2;
        iVar18 = iVar17 % 0xc;
        iVar26 = iVar18 + 7;
        if (-1 < iVar18) {
          iVar26 = iVar18;
        }
        iVar19 = iVar18 % 8 + 3;
        if (-1 < iVar18 % 8) {
          iVar19 = iVar18 % 8;
        }
        ppp_Var14 = (_func_int ***)
                    ((long)(_func_int ***)local_b8.data +
                    (long)((iVar18 % 4 >> 1) + (iVar26 >> 3) + iVar17 / 0xc + (iVar19 >> 2)) *
                    local_b8.cstep * CONCAT44(local_b8.elemsize._4_4_,(undefined4)local_b8.elemsize)
                    );
        uVar20 = 0;
        do {
          if (0 < iVar6) {
            lVar23 = bottom_im2col->cstep * bottom_im2col->elemsize * uVar20;
            lVar27 = (long)bottom_im2col->data + lVar15;
            iVar26 = iVar6;
            do {
              auVar29 = *(undefined1 (*) [16])(lVar27 + -0x10 + lVar23);
              auVar55 = *(undefined1 (*) [16])(lVar27 + lVar23);
              auVar54 = vunpcklps_avx(auVar29,auVar55);
              auVar29 = vunpckhps_avx(auVar29,auVar55);
              *(undefined1 (*) [16])ppp_Var14 = auVar54;
              *(undefined1 (*) [16])(ppp_Var14 + 2) = auVar29;
              ppp_Var14 = ppp_Var14 + 4;
              lVar27 = lVar27 + (long)(int)(uVar5 * 4) * 4;
              iVar26 = iVar26 + -1;
            } while (iVar26 != 0);
          }
          uVar20 = uVar20 + 1;
        } while (uVar20 != uVar28);
      }
      uVar16 = uVar16 + 1;
      lVar15 = lVar15 + 0x20;
    } while (uVar16 != uVar13);
  }
  iVar25 = (uVar5 - iVar25 & 0xfffffffe) + iVar25;
  if (iVar25 < (int)uVar5) {
    lVar15 = (long)iVar25;
    lVar23 = lVar15 << 4;
    do {
      if (0 < (int)_h) {
        iVar26 = (int)lVar15 % 0xc;
        iVar25 = iVar26 + 7;
        if (-1 < iVar26) {
          iVar25 = iVar26;
        }
        iVar17 = iVar26 % 8 + 3;
        if (-1 < iVar26 % 8) {
          iVar17 = iVar26 % 8;
        }
        ppp_Var14 = (_func_int ***)
                    ((long)(_func_int ***)local_b8.data +
                    (long)((iVar26 % 4) / 2 + iVar26 % 2 + (iVar25 >> 3) + (int)lVar15 / 0xc +
                          (iVar17 >> 2)) * local_b8.cstep *
                    CONCAT44(local_b8.elemsize._4_4_,(undefined4)local_b8.elemsize));
        uVar16 = 0;
        do {
          if (0 < iVar6) {
            pauVar22 = (undefined1 (*) [16])
                       ((long)bottom_im2col->data +
                       bottom_im2col->cstep * bottom_im2col->elemsize * uVar16 + lVar23);
            iVar25 = iVar6;
            do {
              *(undefined1 (*) [16])ppp_Var14 = *pauVar22;
              ppp_Var14 = ppp_Var14 + 2;
              pauVar22 = (undefined1 (*) [16])(*pauVar22 + (long)(int)(uVar5 * 4) * 4);
              iVar25 = iVar25 + -1;
            } while (iVar25 != 0);
          }
          uVar16 = uVar16 + 1;
        } while (uVar16 != uVar28);
      }
      lVar15 = lVar15 + 1;
      lVar23 = lVar23 + 0x10;
    } while (lVar15 < (int)uVar5);
  }
  if (0 < (int)local_60) {
    iVar25 = _h * iVar6 * 4;
    local_64 = _h * iVar6 * 4;
    uVar28 = 0;
    do {
      pauVar22 = (undefined1 (*) [16])
                 (local_50->cstep * uVar28 * local_50->elemsize + (long)local_50->data);
      pauVar21 = (undefined1 (*) [16])(uVar28 * 0x10 + (long)local_58);
      if (local_58 == (void *)0x0) {
        pauVar21 = (undefined1 (*) [16])&local_48;
      }
      local_48 = 0;
      uStack_40 = 0;
      if ((int)uVar5 < 0xc) {
        uVar16 = 0;
      }
      else {
        uVar20 = 0;
        do {
          auVar29 = *pauVar21;
          auVar55 = auVar29;
          auVar54 = auVar29;
          auVar53 = auVar29;
          auVar52 = auVar29;
          auVar50 = auVar29;
          auVar48 = auVar29;
          auVar46 = auVar29;
          auVar44 = auVar29;
          auVar41 = auVar29;
          auVar38 = auVar29;
          auVar34 = auVar29;
          if (0 < (int)(_h * iVar6 * 4)) {
            pfVar24 = (float *)(kernel->cstep * uVar28 * kernel->elemsize + (long)kernel->data);
            ppp_Var14 = (_func_int ***)
                        ((long)(_func_int ***)local_b8.data +
                        (uVar20 / 0xc) * local_b8.cstep *
                        CONCAT44(local_b8.elemsize._4_4_,(undefined4)local_b8.elemsize));
            iVar26 = iVar25;
            auVar51 = auVar29;
            auVar49 = auVar29;
            auVar47 = auVar29;
            auVar45 = auVar29;
            auVar42 = auVar29;
            auVar39 = auVar29;
            auVar35 = auVar29;
            auVar30 = auVar29;
            auVar43 = auVar29;
            auVar40 = auVar29;
            auVar36 = auVar29;
            auVar31 = auVar29;
            do {
              fVar2 = *pfVar24;
              fVar3 = pfVar24[1];
              fVar4 = pfVar24[2];
              fVar7 = pfVar24[3];
              fVar1 = *(float *)ppp_Var14;
              auVar29._0_4_ = fVar1 * fVar2 + auVar51._0_4_;
              auVar29._4_4_ = fVar1 * fVar3 + auVar51._4_4_;
              auVar29._8_4_ = fVar1 * fVar4 + auVar51._8_4_;
              auVar29._12_4_ = fVar1 * fVar7 + auVar51._12_4_;
              fVar1 = *(float *)((long)ppp_Var14 + 4);
              auVar55._0_4_ = fVar1 * fVar2 + auVar31._0_4_;
              auVar55._4_4_ = fVar1 * fVar3 + auVar31._4_4_;
              auVar55._8_4_ = fVar1 * fVar4 + auVar31._8_4_;
              auVar55._12_4_ = fVar1 * fVar7 + auVar31._12_4_;
              fVar1 = *(float *)(ppp_Var14 + 1);
              auVar54._0_4_ = fVar1 * fVar2 + auVar36._0_4_;
              auVar54._4_4_ = fVar1 * fVar3 + auVar36._4_4_;
              auVar54._8_4_ = fVar1 * fVar4 + auVar36._8_4_;
              auVar54._12_4_ = fVar1 * fVar7 + auVar36._12_4_;
              fVar1 = *(float *)((long)(ppp_Var14 + 1) + 4);
              auVar53._0_4_ = fVar1 * fVar2 + auVar40._0_4_;
              auVar53._4_4_ = fVar1 * fVar3 + auVar40._4_4_;
              auVar53._8_4_ = fVar1 * fVar4 + auVar40._8_4_;
              auVar53._12_4_ = fVar1 * fVar7 + auVar40._12_4_;
              fVar1 = *(float *)(ppp_Var14 + 2);
              auVar52._0_4_ = fVar1 * fVar2 + auVar43._0_4_;
              auVar52._4_4_ = fVar1 * fVar3 + auVar43._4_4_;
              auVar52._8_4_ = fVar1 * fVar4 + auVar43._8_4_;
              auVar52._12_4_ = fVar1 * fVar7 + auVar43._12_4_;
              fVar1 = *(float *)((long)(ppp_Var14 + 2) + 4);
              auVar50._0_4_ = fVar1 * fVar2 + auVar30._0_4_;
              auVar50._4_4_ = fVar1 * fVar3 + auVar30._4_4_;
              auVar50._8_4_ = fVar1 * fVar4 + auVar30._8_4_;
              auVar50._12_4_ = fVar1 * fVar7 + auVar30._12_4_;
              fVar1 = *(float *)(ppp_Var14 + 3);
              auVar48._0_4_ = fVar1 * fVar2 + auVar35._0_4_;
              auVar48._4_4_ = fVar1 * fVar3 + auVar35._4_4_;
              auVar48._8_4_ = fVar1 * fVar4 + auVar35._8_4_;
              auVar48._12_4_ = fVar1 * fVar7 + auVar35._12_4_;
              fVar1 = *(float *)((long)(ppp_Var14 + 3) + 4);
              auVar46._0_4_ = fVar1 * fVar2 + auVar39._0_4_;
              auVar46._4_4_ = fVar1 * fVar3 + auVar39._4_4_;
              auVar46._8_4_ = fVar1 * fVar4 + auVar39._8_4_;
              auVar46._12_4_ = fVar1 * fVar7 + auVar39._12_4_;
              fVar1 = *(float *)(ppp_Var14 + 4);
              auVar44._0_4_ = fVar1 * fVar2 + auVar42._0_4_;
              auVar44._4_4_ = fVar1 * fVar3 + auVar42._4_4_;
              auVar44._8_4_ = fVar1 * fVar4 + auVar42._8_4_;
              auVar44._12_4_ = fVar1 * fVar7 + auVar42._12_4_;
              fVar1 = *(float *)((long)(ppp_Var14 + 4) + 4);
              auVar41._0_4_ = fVar1 * fVar2 + auVar45._0_4_;
              auVar41._4_4_ = fVar1 * fVar3 + auVar45._4_4_;
              auVar41._8_4_ = fVar1 * fVar4 + auVar45._8_4_;
              auVar41._12_4_ = fVar1 * fVar7 + auVar45._12_4_;
              fVar1 = *(float *)(ppp_Var14 + 5);
              auVar38._0_4_ = fVar1 * fVar2 + auVar47._0_4_;
              auVar38._4_4_ = fVar1 * fVar3 + auVar47._4_4_;
              auVar38._8_4_ = fVar1 * fVar4 + auVar47._8_4_;
              auVar38._12_4_ = fVar1 * fVar7 + auVar47._12_4_;
              fVar1 = *(float *)((long)(ppp_Var14 + 5) + 4);
              auVar34._0_4_ = fVar1 * fVar2 + auVar49._0_4_;
              auVar34._4_4_ = fVar1 * fVar3 + auVar49._4_4_;
              auVar34._8_4_ = fVar1 * fVar4 + auVar49._8_4_;
              auVar34._12_4_ = fVar1 * fVar7 + auVar49._12_4_;
              ppp_Var14 = ppp_Var14 + 6;
              pfVar24 = pfVar24 + 4;
              iVar26 = iVar26 + -1;
              auVar51 = auVar29;
              auVar49 = auVar34;
              auVar47 = auVar38;
              auVar45 = auVar41;
              auVar42 = auVar44;
              auVar39 = auVar46;
              auVar35 = auVar48;
              auVar30 = auVar50;
              auVar43 = auVar52;
              auVar40 = auVar53;
              auVar36 = auVar54;
              auVar31 = auVar55;
            } while (iVar26 != 0);
          }
          *pauVar22 = auVar29;
          pauVar22[1] = auVar55;
          pauVar22[2] = auVar54;
          pauVar22[3] = auVar53;
          pauVar22[4] = auVar52;
          pauVar22[5] = auVar50;
          pauVar22[6] = auVar48;
          pauVar22[7] = auVar46;
          pauVar22[8] = auVar44;
          pauVar22[9] = auVar41;
          pauVar22[10] = auVar38;
          pauVar22[0xb] = auVar34;
          pauVar22 = pauVar22 + 0xc;
          uVar16 = uVar20 + 0xc;
          iVar26 = (int)uVar20;
          uVar20 = uVar16;
        } while (iVar26 + 0x17 < (int)uVar5);
      }
      iVar26 = (int)uVar16 + 7;
      while (uVar13 = (uint)uVar16, iVar26 < (int)uVar5) {
        auVar51 = *pauVar21;
        auVar49 = auVar51;
        auVar47 = auVar51;
        auVar45 = auVar51;
        auVar42 = auVar51;
        auVar39 = auVar51;
        auVar35 = auVar51;
        auVar30 = auVar51;
        if (0 < (int)(_h * iVar6 * 4)) {
          lVar15 = local_b8.cstep * CONCAT44(local_b8.elemsize._4_4_,(undefined4)local_b8.elemsize)
                   * (ulong)((uVar13 + (int)((uVar16 & 0xffffffff) / 0xc) * -0xc >> 3) +
                            (int)((uVar16 & 0xffffffff) / 0xc));
          lVar23 = 0;
          iVar26 = iVar25;
          auVar29 = auVar51;
          auVar55 = auVar51;
          auVar54 = auVar51;
          auVar53 = auVar51;
          auVar52 = auVar51;
          auVar50 = auVar51;
          auVar48 = auVar51;
          auVar46 = auVar51;
          do {
            pfVar24 = (float *)((long)kernel->data +
                               lVar23 + kernel->cstep * uVar28 * kernel->elemsize);
            fVar2 = *pfVar24;
            fVar3 = pfVar24[1];
            fVar4 = pfVar24[2];
            fVar7 = pfVar24[3];
            fVar1 = *(float *)((long)(_func_int ***)local_b8.data + lVar23 * 2 + lVar15);
            auVar51._0_4_ = fVar1 * fVar2 + auVar46._0_4_;
            auVar51._4_4_ = fVar1 * fVar3 + auVar46._4_4_;
            auVar51._8_4_ = fVar1 * fVar4 + auVar46._8_4_;
            auVar51._12_4_ = fVar1 * fVar7 + auVar46._12_4_;
            fVar1 = *(float *)((long)(_func_int ***)local_b8.data + lVar23 * 2 + lVar15 + 4);
            auVar49._0_4_ = fVar1 * fVar2 + auVar48._0_4_;
            auVar49._4_4_ = fVar1 * fVar3 + auVar48._4_4_;
            auVar49._8_4_ = fVar1 * fVar4 + auVar48._8_4_;
            auVar49._12_4_ = fVar1 * fVar7 + auVar48._12_4_;
            fVar1 = *(float *)((long)&((Allocator *)((long)local_b8.data + 8))->_vptr_Allocator +
                              lVar23 * 2 + lVar15);
            auVar47._0_4_ = fVar1 * fVar2 + auVar50._0_4_;
            auVar47._4_4_ = fVar1 * fVar3 + auVar50._4_4_;
            auVar47._8_4_ = fVar1 * fVar4 + auVar50._8_4_;
            auVar47._12_4_ = fVar1 * fVar7 + auVar50._12_4_;
            fVar1 = *(float *)((long)&((Allocator *)((long)local_b8.data + 8))->_vptr_Allocator +
                              lVar23 * 2 + lVar15 + 4);
            auVar45._0_4_ = fVar1 * fVar2 + auVar52._0_4_;
            auVar45._4_4_ = fVar1 * fVar3 + auVar52._4_4_;
            auVar45._8_4_ = fVar1 * fVar4 + auVar52._8_4_;
            auVar45._12_4_ = fVar1 * fVar7 + auVar52._12_4_;
            fVar1 = *(float *)((long)&((Allocator *)((long)local_b8.data + 0x10))->_vptr_Allocator +
                              lVar23 * 2 + lVar15);
            auVar42._0_4_ = fVar1 * fVar2 + auVar53._0_4_;
            auVar42._4_4_ = fVar1 * fVar3 + auVar53._4_4_;
            auVar42._8_4_ = fVar1 * fVar4 + auVar53._8_4_;
            auVar42._12_4_ = fVar1 * fVar7 + auVar53._12_4_;
            fVar1 = *(float *)((long)&((Allocator *)((long)local_b8.data + 0x10))->_vptr_Allocator +
                              lVar23 * 2 + lVar15 + 4);
            auVar39._0_4_ = fVar1 * fVar2 + auVar54._0_4_;
            auVar39._4_4_ = fVar1 * fVar3 + auVar54._4_4_;
            auVar39._8_4_ = fVar1 * fVar4 + auVar54._8_4_;
            auVar39._12_4_ = fVar1 * fVar7 + auVar54._12_4_;
            fVar1 = *(float *)((long)&((Allocator *)((long)local_b8.data + 0x18))->_vptr_Allocator +
                              lVar23 * 2 + lVar15);
            auVar35._0_4_ = fVar1 * fVar2 + auVar55._0_4_;
            auVar35._4_4_ = fVar1 * fVar3 + auVar55._4_4_;
            auVar35._8_4_ = fVar1 * fVar4 + auVar55._8_4_;
            auVar35._12_4_ = fVar1 * fVar7 + auVar55._12_4_;
            fVar1 = *(float *)((long)&((Allocator *)((long)local_b8.data + 0x18))->_vptr_Allocator +
                              lVar23 * 2 + lVar15 + 4);
            auVar30._0_4_ = fVar1 * fVar2 + auVar29._0_4_;
            auVar30._4_4_ = fVar1 * fVar3 + auVar29._4_4_;
            auVar30._8_4_ = fVar1 * fVar4 + auVar29._8_4_;
            auVar30._12_4_ = fVar1 * fVar7 + auVar29._12_4_;
            lVar23 = lVar23 + 0x10;
            iVar26 = iVar26 + -1;
            auVar29 = auVar30;
            auVar55 = auVar35;
            auVar54 = auVar39;
            auVar53 = auVar42;
            auVar52 = auVar45;
            auVar50 = auVar47;
            auVar48 = auVar49;
            auVar46 = auVar51;
          } while (iVar26 != 0);
        }
        *pauVar22 = auVar51;
        pauVar22[1] = auVar49;
        pauVar22[2] = auVar47;
        pauVar22[3] = auVar45;
        pauVar22[4] = auVar42;
        pauVar22[5] = auVar39;
        pauVar22[6] = auVar35;
        pauVar22[7] = auVar30;
        pauVar22 = pauVar22 + 8;
        uVar16 = (ulong)(uVar13 + 8);
        iVar26 = uVar13 + 0xf;
      }
      uVar13 = uVar13 | 3;
      while (uVar12 = (uint)uVar16, (int)uVar13 < (int)uVar5) {
        uVar13 = uVar12 + (int)((uVar16 & 0xffffffff) / 0xc) * -0xc;
        auVar43 = *pauVar21;
        auVar40 = auVar43;
        auVar36 = auVar43;
        auVar31 = auVar43;
        if (0 < (int)(_h * iVar6 * 4)) {
          lVar15 = local_b8.cstep * CONCAT44(local_b8.elemsize._4_4_,(undefined4)local_b8.elemsize)
                   * (ulong)((uVar13 >> 3) + (int)((uVar16 & 0xffffffff) / 0xc) +
                            (uint)((uVar13 >> 2 & 1) != 0));
          lVar23 = 0;
          iVar26 = iVar25;
          auVar29 = auVar43;
          auVar55 = auVar43;
          auVar54 = auVar43;
          auVar53 = auVar43;
          do {
            pfVar24 = (float *)((long)kernel->data +
                               lVar23 + kernel->cstep * uVar28 * kernel->elemsize);
            fVar7 = *pfVar24;
            fVar8 = pfVar24[1];
            fVar9 = pfVar24[2];
            fVar10 = pfVar24[3];
            fVar1 = *(float *)((long)(_func_int ***)local_b8.data + lVar23 + lVar15);
            fVar2 = *(float *)((long)(_func_int ***)local_b8.data + lVar23 + lVar15 + 4);
            fVar3 = *(float *)((long)&((Allocator *)((long)local_b8.data + 8))->_vptr_Allocator +
                              lVar23 + lVar15);
            fVar4 = *(float *)((long)&((Allocator *)((long)local_b8.data + 8))->_vptr_Allocator +
                              lVar23 + lVar15 + 4);
            auVar43._0_4_ = fVar1 * fVar7 + auVar53._0_4_;
            auVar43._4_4_ = fVar1 * fVar8 + auVar53._4_4_;
            auVar43._8_4_ = fVar1 * fVar9 + auVar53._8_4_;
            auVar43._12_4_ = fVar1 * fVar10 + auVar53._12_4_;
            auVar40._0_4_ = fVar2 * fVar7 + auVar54._0_4_;
            auVar40._4_4_ = fVar2 * fVar8 + auVar54._4_4_;
            auVar40._8_4_ = fVar2 * fVar9 + auVar54._8_4_;
            auVar40._12_4_ = fVar2 * fVar10 + auVar54._12_4_;
            auVar36._0_4_ = fVar3 * fVar7 + auVar55._0_4_;
            auVar36._4_4_ = fVar3 * fVar8 + auVar55._4_4_;
            auVar36._8_4_ = fVar3 * fVar9 + auVar55._8_4_;
            auVar36._12_4_ = fVar3 * fVar10 + auVar55._12_4_;
            auVar31._0_4_ = fVar4 * fVar7 + auVar29._0_4_;
            auVar31._4_4_ = fVar4 * fVar8 + auVar29._4_4_;
            auVar31._8_4_ = fVar4 * fVar9 + auVar29._8_4_;
            auVar31._12_4_ = fVar4 * fVar10 + auVar29._12_4_;
            lVar23 = lVar23 + 0x10;
            iVar26 = iVar26 + -1;
            auVar29 = auVar31;
            auVar55 = auVar36;
            auVar54 = auVar40;
            auVar53 = auVar43;
          } while (iVar26 != 0);
        }
        *pauVar22 = auVar43;
        pauVar22[1] = auVar40;
        pauVar22[2] = auVar36;
        pauVar22[3] = auVar31;
        pauVar22 = pauVar22 + 4;
        uVar16 = (ulong)(uVar12 + 4);
        uVar13 = uVar12 + 7;
      }
      uVar12 = uVar12 | 1;
      while (iVar26 = (int)uVar16, (int)uVar12 < (int)uVar5) {
        uVar13 = iVar26 + (int)((uVar16 & 0xffffffff) / 0xc) * -0xc;
        auVar37 = *pauVar21;
        auVar32 = auVar37;
        if (0 < local_64) {
          pfVar24 = (float *)(kernel->cstep * uVar28 * kernel->elemsize + (long)kernel->data);
          lVar15 = local_b8.cstep * CONCAT44(local_b8.elemsize._4_4_,(undefined4)local_b8.elemsize)
                   * (ulong)((uVar13 >> 2 & 1) + (uVar13 >> 3) + (int)((uVar16 & 0xffffffff) / 0xc)
                            + (uint)((uVar13 >> 1 & 1) != 0));
          lVar23 = 0;
          auVar29 = auVar37;
          auVar55 = auVar37;
          do {
            fVar1 = *(float *)((long)&((Allocator *)((long)local_b8.data + lVar23 * 8))->
                                      _vptr_Allocator + lVar15);
            fVar2 = *(float *)((long)&((Allocator *)((long)local_b8.data + lVar23 * 8))->
                                      _vptr_Allocator + lVar15 + 4);
            auVar37._0_4_ = fVar1 * *pfVar24 + auVar55._0_4_;
            auVar37._4_4_ = fVar1 * pfVar24[1] + auVar55._4_4_;
            auVar37._8_4_ = fVar1 * pfVar24[2] + auVar55._8_4_;
            auVar37._12_4_ = fVar1 * pfVar24[3] + auVar55._12_4_;
            auVar32._0_4_ = fVar2 * *pfVar24 + auVar29._0_4_;
            auVar32._4_4_ = fVar2 * pfVar24[1] + auVar29._4_4_;
            auVar32._8_4_ = fVar2 * pfVar24[2] + auVar29._8_4_;
            auVar32._12_4_ = fVar2 * pfVar24[3] + auVar29._12_4_;
            pfVar24 = pfVar24 + 4;
            lVar23 = lVar23 + 1;
            auVar29 = auVar32;
            auVar55 = auVar37;
          } while (iVar25 != (int)lVar23);
        }
        *pauVar22 = auVar37;
        pauVar22[1] = auVar32;
        pauVar22 = pauVar22 + 2;
        uVar16 = (ulong)(iVar26 + 2);
        uVar12 = iVar26 + 3;
      }
      if (iVar26 < (int)uVar5) {
        do {
          uVar13 = (uint)uVar16;
          uVar12 = uVar13 + (int)((uVar16 & 0xffffffff) / 0xc) * -0xc;
          auVar33 = *pauVar21;
          if (0 < (int)(_h * iVar6 * 4)) {
            pfVar24 = (float *)(kernel->cstep * uVar28 * kernel->elemsize + (long)kernel->data);
            lVar15 = 0;
            auVar29 = auVar33;
            do {
              fVar1 = *(float *)((long)(_func_int ***)local_b8.data +
                                lVar15 * 4 +
                                local_b8.cstep *
                                CONCAT44(local_b8.elemsize._4_4_,(undefined4)local_b8.elemsize) *
                                (ulong)((uVar12 >> 2 & 1) +
                                        (uVar13 & 1) + (int)((uVar16 & 0xffffffff) / 0xc) +
                                        (uVar12 >> 3) + (uint)((uVar12 >> 1 & 1) != 0)));
              auVar33._0_4_ = fVar1 * *pfVar24 + auVar29._0_4_;
              auVar33._4_4_ = fVar1 * pfVar24[1] + auVar29._4_4_;
              auVar33._8_4_ = fVar1 * pfVar24[2] + auVar29._8_4_;
              auVar33._12_4_ = fVar1 * pfVar24[3] + auVar29._12_4_;
              pfVar24 = pfVar24 + 4;
              lVar15 = lVar15 + 1;
              auVar29 = auVar33;
            } while (iVar25 != (int)lVar15);
          }
          *pauVar22 = auVar33;
          pauVar22 = pauVar22 + 1;
          uVar16 = (ulong)(uVar13 + 1);
        } while (uVar13 + 1 != uVar5);
      }
      uVar28 = uVar28 + 1;
    } while (uVar28 != local_60);
  }
  piVar11 = (int *)CONCAT44(local_b8.refcount._4_4_,(int)local_b8.refcount);
  if (piVar11 != (int *)0x0) {
    LOCK();
    *piVar11 = *piVar11 + -1;
    UNLOCK();
    if (*piVar11 == 0) {
      if (local_b8.allocator == (Allocator *)0x0) {
        if ((Allocator *)local_b8.data != (Allocator *)0x0) {
          free(local_b8.data);
        }
      }
      else {
        (*(local_b8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void im2col_sgemm_pack4_sse(const Mat& bottom_im2col, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    // Mat bottom_im2col(size, maxk, inch, 4u * 4, 4, opt.workspace_allocator);

    const int size = bottom_im2col.w;
    const int maxk = bottom_im2col.h;
    const int inch = bottom_im2col.c;

    const int outch = top_blob.c;

    const float* bias = _bias;

    // permute
    Mat tmp;
    if (size >= 12)
        tmp.create(12 * maxk, inch, size / 12 + (size % 12) / 8 + (size % 12 % 8) / 4 + (size % 12 % 4) / 2 + size % 12 % 2, 4u * 4, 4, opt.workspace_allocator);
    else if (size >= 8)
        tmp.create(8 * maxk, inch, size / 8 + (size % 8) / 4 + (size % 4) / 2 + size % 2, 4u * 4, 4, opt.workspace_allocator);
    else if (size >= 4)
        tmp.create(4 * maxk, inch, size / 4 + (size % 4) / 2 + size % 2, 4u * 4, 4, opt.workspace_allocator);
    else if (size >= 2)
        tmp.create(2 * maxk, inch, size / 2 + size % 2, 4u * 4, 4, opt.workspace_allocator);
    else
        tmp.create(maxk, inch, size, 4u * 4, 4, opt.workspace_allocator);
    {
        int remain_size_start = 0;
        int nn_size = size / 12;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 12;

            float* tmpptr = tmp.channel(i / 12);

            for (int q = 0; q < inch; q++)
            {
                const float* img0 = (const float*)bottom_im2col.channel(q) + i * 4;

                for (int k = 0; k < maxk; k++)
                {
                    // transpose 4x12
                    __m128 _r0 = _mm_load_ps(img0);
                    __m128 _r1 = _mm_load_ps(img0 + 4);
                    __m128 _r2 = _mm_load_ps(img0 + 4 * 2);
                    __m128 _r3 = _mm_load_ps(img0 + 4 * 3);
                    __m128 _r4 = _mm_load_ps(img0 + 4 * 4);
                    __m128 _r5 = _mm_load_ps(img0 + 4 * 5);
                    __m128 _r6 = _mm_load_ps(img0 + 4 * 6);
                    __m128 _r7 = _mm_load_ps(img0 + 4 * 7);
                    __m128 _r8 = _mm_load_ps(img0 + 4 * 8);
                    __m128 _r9 = _mm_load_ps(img0 + 4 * 9);
                    __m128 _ra = _mm_load_ps(img0 + 4 * 10);
                    __m128 _rb = _mm_load_ps(img0 + 4 * 11);

                    _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                    _MM_TRANSPOSE4_PS(_r4, _r5, _r6, _r7);
                    _MM_TRANSPOSE4_PS(_r8, _r9, _ra, _rb);

                    _mm_store_ps(tmpptr, _r0);
                    _mm_store_ps(tmpptr + 4, _r4);
                    _mm_store_ps(tmpptr + 4 * 2, _r8);
                    _mm_store_ps(tmpptr + 4 * 3, _r1);
                    _mm_store_ps(tmpptr + 4 * 4, _r5);
                    _mm_store_ps(tmpptr + 4 * 5, _r9);
                    _mm_store_ps(tmpptr + 4 * 6, _r2);
                    _mm_store_ps(tmpptr + 4 * 7, _r6);
                    _mm_store_ps(tmpptr + 4 * 8, _ra);
                    _mm_store_ps(tmpptr + 4 * 9, _r3);
                    _mm_store_ps(tmpptr + 4 * 10, _r7);
                    _mm_store_ps(tmpptr + 4 * 11, _rb);

                    img0 += size * 4;
                    tmpptr += 48;
                }
            }
        }

        remain_size_start += nn_size * 12;
        nn_size = (size - remain_size_start) >> 3;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 8;

            float* tmpptr = tmp.channel(i / 12 + (i % 12) / 8);

            for (int q = 0; q < inch; q++)
            {
                const float* img0 = (const float*)bottom_im2col.channel(q) + i * 4;

                for (int k = 0; k < maxk; k++)
                {
                    // transpose 4x8
                    __m128 _r0 = _mm_load_ps(img0);
                    __m128 _r1 = _mm_load_ps(img0 + 4);
                    __m128 _r2 = _mm_load_ps(img0 + 4 * 2);
                    __m128 _r3 = _mm_load_ps(img0 + 4 * 3);
                    __m128 _r4 = _mm_load_ps(img0 + 4 * 4);
                    __m128 _r5 = _mm_load_ps(img0 + 4 * 5);
                    __m128 _r6 = _mm_load_ps(img0 + 4 * 6);
                    __m128 _r7 = _mm_load_ps(img0 + 4 * 7);

                    _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                    _MM_TRANSPOSE4_PS(_r4, _r5, _r6, _r7);

                    _mm_store_ps(tmpptr, _r0);
                    _mm_store_ps(tmpptr + 4, _r4);
                    _mm_store_ps(tmpptr + 4 * 2, _r1);
                    _mm_store_ps(tmpptr + 4 * 3, _r5);
                    _mm_store_ps(tmpptr + 4 * 4, _r2);
                    _mm_store_ps(tmpptr + 4 * 5, _r6);
                    _mm_store_ps(tmpptr + 4 * 6, _r3);
                    _mm_store_ps(tmpptr + 4 * 7, _r7);

                    img0 += size * 4;
                    tmpptr += 32;
                }
            }
        }

        remain_size_start += nn_size << 3;
        nn_size = (size - remain_size_start) >> 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 4;

            float* tmpptr = tmp.channel(i / 12 + (i % 12) / 8 + (i % 12 % 8) / 4);

            for (int q = 0; q < inch; q++)
            {
                const float* img0 = (const float*)bottom_im2col.channel(q) + i * 4;

                for (int k = 0; k < maxk; k++)
                {
                    // transpose 4x4
                    __m128 _r0 = _mm_load_ps(img0);
                    __m128 _r1 = _mm_load_ps(img0 + 4);
                    __m128 _r2 = _mm_load_ps(img0 + 4 * 2);
                    __m128 _r3 = _mm_load_ps(img0 + 4 * 3);

                    _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);

                    _mm_store_ps(tmpptr, _r0);
                    _mm_store_ps(tmpptr + 4, _r1);
                    _mm_store_ps(tmpptr + 4 * 2, _r2);
                    _mm_store_ps(tmpptr + 4 * 3, _r3);

                    img0 += size * 4;
                    tmpptr += 16;
                }
            }
        }

        remain_size_start += nn_size << 2;
        nn_size = (size - remain_size_start) >> 1;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 2;

            float* tmpptr = tmp.channel(i / 12 + (i % 12) / 8 + (i % 12 % 8) / 4 + (i % 12 % 4) / 2);

            for (int q = 0; q < inch; q++)
            {
                const float* img0 = (const float*)bottom_im2col.channel(q) + i * 4;

                for (int k = 0; k < maxk; k++)
                {
                    // transpose 4x2
                    __m128 _r0 = _mm_load_ps(img0);
                    __m128 _r1 = _mm_load_ps(img0 + 4);

                    __m128 _r01_0 = _mm_unpacklo_ps(_r0, _r1);
                    __m128 _r01_1 = _mm_unpackhi_ps(_r0, _r1);

                    _mm_store_ps(tmpptr, _r01_0);
                    _mm_store_ps(tmpptr + 4, _r01_1);

                    img0 += size * 4;
                    tmpptr += 8;
                }
            }
        }

        remain_size_start += nn_size << 1;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = remain_size_start; i < size; i++)
        {
            float* tmpptr = tmp.channel(i / 12 + (i % 12) / 8 + (i % 12 % 8) / 4 + (i % 12 % 4) / 2 + i % 12 % 2);

            for (int q = 0; q < inch; q++)
            {
                const float* img0 = (const float*)bottom_im2col.channel(q) + i * 4;

                for (int k = 0; k < maxk; k++)
                {
                    __m128 _val = _mm_load_ps(img0);
                    _mm_store_ps(tmpptr, _val);

                    img0 += size * 4;
                    tmpptr += 4;
                }
            }
        }
    }

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        float* outptr0 = top_blob.channel(p);

        const float zeros[4] = {0.f, 0.f, 0.f, 0.f};
        const float* biasptr = bias ? bias + p * 4 : zeros;

        int i = 0;
        for (; i + 11 < size; i += 12)
        {
            const float* tmpptr = tmp.channel(i / 12);
            const float* kptr0 = kernel.channel(p);

            int nn = inch * maxk * 4; // inch always > 0

            __m128 _sum0 = _mm_loadu_ps(biasptr);
            __m128 _sum1 = _sum0;
            __m128 _sum2 = _sum0;
            __m128 _sum3 = _sum0;
            __m128 _sum4 = _sum0;
            __m128 _sum5 = _sum0;
            __m128 _sum6 = _sum0;
            __m128 _sum7 = _sum0;
            __m128 _sum8 = _sum0;
            __m128 _sum9 = _sum0;
            __m128 _suma = _sum0;
            __m128 _sumb = _sum0;

            for (int j = 0; j < nn; j++)
            {
                __m128 _w0 = _mm_load_ps(kptr0);

                __m128 _val0 = _mm_load1_ps(tmpptr);
                __m128 _val1 = _mm_load1_ps(tmpptr + 1);
                __m128 _val2 = _mm_load1_ps(tmpptr + 2);
                __m128 _val3 = _mm_load1_ps(tmpptr + 3);
                __m128 _val4 = _mm_load1_ps(tmpptr + 4);
                __m128 _val5 = _mm_load1_ps(tmpptr + 5);
                __m128 _val6 = _mm_load1_ps(tmpptr + 6);
                __m128 _val7 = _mm_load1_ps(tmpptr + 7);
                __m128 _val8 = _mm_load1_ps(tmpptr + 8);
                __m128 _val9 = _mm_load1_ps(tmpptr + 9);
                __m128 _vala = _mm_load1_ps(tmpptr + 10);
                __m128 _valb = _mm_load1_ps(tmpptr + 11);

                _sum0 = _mm_comp_fmadd_ps(_val0, _w0, _sum0);
                _sum1 = _mm_comp_fmadd_ps(_val1, _w0, _sum1);
                _sum2 = _mm_comp_fmadd_ps(_val2, _w0, _sum2);
                _sum3 = _mm_comp_fmadd_ps(_val3, _w0, _sum3);
                _sum4 = _mm_comp_fmadd_ps(_val4, _w0, _sum4);
                _sum5 = _mm_comp_fmadd_ps(_val5, _w0, _sum5);
                _sum6 = _mm_comp_fmadd_ps(_val6, _w0, _sum6);
                _sum7 = _mm_comp_fmadd_ps(_val7, _w0, _sum7);
                _sum8 = _mm_comp_fmadd_ps(_val8, _w0, _sum8);
                _sum9 = _mm_comp_fmadd_ps(_val9, _w0, _sum9);
                _suma = _mm_comp_fmadd_ps(_vala, _w0, _suma);
                _sumb = _mm_comp_fmadd_ps(_valb, _w0, _sumb);

                tmpptr += 12;
                kptr0 += 4;
            }

            _mm_store_ps(outptr0, _sum0);
            _mm_store_ps(outptr0 + 4, _sum1);
            _mm_store_ps(outptr0 + 4 * 2, _sum2);
            _mm_store_ps(outptr0 + 4 * 3, _sum3);
            _mm_store_ps(outptr0 + 4 * 4, _sum4);
            _mm_store_ps(outptr0 + 4 * 5, _sum5);
            _mm_store_ps(outptr0 + 4 * 6, _sum6);
            _mm_store_ps(outptr0 + 4 * 7, _sum7);
            _mm_store_ps(outptr0 + 4 * 8, _sum8);
            _mm_store_ps(outptr0 + 4 * 9, _sum9);
            _mm_store_ps(outptr0 + 4 * 10, _suma);
            _mm_store_ps(outptr0 + 4 * 11, _sumb);

            outptr0 += 4 * 12;
        }
        for (; i + 7 < size; i += 8)
        {
            const float* tmpptr = tmp.channel(i / 12 + (i % 12) / 8);
            const float* kptr0 = kernel.channel(p);

            int nn = inch * maxk * 4; // inch always > 0

            __m128 _sum0 = _mm_loadu_ps(biasptr);
            __m128 _sum1 = _sum0;
            __m128 _sum2 = _sum0;
            __m128 _sum3 = _sum0;
            __m128 _sum4 = _sum0;
            __m128 _sum5 = _sum0;
            __m128 _sum6 = _sum0;
            __m128 _sum7 = _sum0;

            for (int j = 0; j < nn; j++)
            {
                __m128 _w0 = _mm_load_ps(kptr0);

                __m128 _val0 = _mm_load1_ps(tmpptr);
                __m128 _val1 = _mm_load1_ps(tmpptr + 1);
                __m128 _val2 = _mm_load1_ps(tmpptr + 2);
                __m128 _val3 = _mm_load1_ps(tmpptr + 3);
                __m128 _val4 = _mm_load1_ps(tmpptr + 4);
                __m128 _val5 = _mm_load1_ps(tmpptr + 5);
                __m128 _val6 = _mm_load1_ps(tmpptr + 6);
                __m128 _val7 = _mm_load1_ps(tmpptr + 7);

                _sum0 = _mm_comp_fmadd_ps(_val0, _w0, _sum0);
                _sum1 = _mm_comp_fmadd_ps(_val1, _w0, _sum1);
                _sum2 = _mm_comp_fmadd_ps(_val2, _w0, _sum2);
                _sum3 = _mm_comp_fmadd_ps(_val3, _w0, _sum3);
                _sum4 = _mm_comp_fmadd_ps(_val4, _w0, _sum4);
                _sum5 = _mm_comp_fmadd_ps(_val5, _w0, _sum5);
                _sum6 = _mm_comp_fmadd_ps(_val6, _w0, _sum6);
                _sum7 = _mm_comp_fmadd_ps(_val7, _w0, _sum7);

                tmpptr += 8;
                kptr0 += 4;
            }

            _mm_store_ps(outptr0, _sum0);
            _mm_store_ps(outptr0 + 4, _sum1);
            _mm_store_ps(outptr0 + 4 * 2, _sum2);
            _mm_store_ps(outptr0 + 4 * 3, _sum3);
            _mm_store_ps(outptr0 + 4 * 4, _sum4);
            _mm_store_ps(outptr0 + 4 * 5, _sum5);
            _mm_store_ps(outptr0 + 4 * 6, _sum6);
            _mm_store_ps(outptr0 + 4 * 7, _sum7);

            outptr0 += 4 * 8;
        }
        for (; i + 3 < size; i += 4)
        {
            const float* tmpptr = tmp.channel(i / 12 + (i % 12) / 8 + (i % 12 % 8) / 4);
            const float* kptr0 = kernel.channel(p);

            int nn = inch * maxk * 4; // inch always > 0

            __m128 _sum0 = _mm_loadu_ps(biasptr);
            __m128 _sum1 = _sum0;
            __m128 _sum2 = _sum0;
            __m128 _sum3 = _sum0;

            for (int j = 0; j < nn; j++)
            {
                __m128 _w0 = _mm_load_ps(kptr0);

                __m128 _val0 = _mm_load1_ps(tmpptr);
                __m128 _val1 = _mm_load1_ps(tmpptr + 1);
                __m128 _val2 = _mm_load1_ps(tmpptr + 2);
                __m128 _val3 = _mm_load1_ps(tmpptr + 3);

                _sum0 = _mm_comp_fmadd_ps(_val0, _w0, _sum0);
                _sum1 = _mm_comp_fmadd_ps(_val1, _w0, _sum1);
                _sum2 = _mm_comp_fmadd_ps(_val2, _w0, _sum2);
                _sum3 = _mm_comp_fmadd_ps(_val3, _w0, _sum3);

                tmpptr += 4;
                kptr0 += 4;
            }

            _mm_store_ps(outptr0, _sum0);
            _mm_store_ps(outptr0 + 4, _sum1);
            _mm_store_ps(outptr0 + 4 * 2, _sum2);
            _mm_store_ps(outptr0 + 4 * 3, _sum3);

            outptr0 += 4 * 4;
        }
        for (; i + 1 < size; i += 2)
        {
            const float* tmpptr = tmp.channel(i / 12 + (i % 12) / 8 + (i % 12 % 8) / 4 + (i % 12 % 4) / 2);
            const float* kptr0 = kernel.channel(p);

            int nn = inch * maxk * 4; // inch always > 0

            __m128 _sum0 = _mm_loadu_ps(biasptr);
            __m128 _sum1 = _sum0;

            for (int j = 0; j < nn; j++)
            {
                __m128 _w0 = _mm_load_ps(kptr0);

                __m128 _val0 = _mm_load1_ps(tmpptr);
                __m128 _val1 = _mm_load1_ps(tmpptr + 1);

                _sum0 = _mm_comp_fmadd_ps(_val0, _w0, _sum0);
                _sum1 = _mm_comp_fmadd_ps(_val1, _w0, _sum1);

                tmpptr += 2;
                kptr0 += 4;
            }

            _mm_store_ps(outptr0, _sum0);
            _mm_store_ps(outptr0 + 4, _sum1);

            outptr0 += 4 * 2;
        }
        for (; i < size; i++)
        {
            const float* tmpptr = tmp.channel(i / 12 + (i % 12) / 8 + (i % 12 % 8) / 4 + (i % 12 % 4) / 2 + i % 12 % 2);
            const float* kptr0 = kernel.channel(p);

            int nn = inch * maxk * 4; // inch always > 0

            __m128 _sum = _mm_loadu_ps(biasptr);

            for (int j = 0; j < nn; j++)
            {
                __m128 _w0 = _mm_load_ps(kptr0);
                __m128 _val0 = _mm_load1_ps(tmpptr);
                _sum = _mm_comp_fmadd_ps(_val0, _w0, _sum);

                tmpptr += 1;
                kptr0 += 4;
            }

            _mm_store_ps(outptr0, _sum);

            outptr0 += 4;
        }
    }
}